

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Promise<void> __thiscall kj::joinPromises(kj *this,Array<kj::Promise<void>_> *promises)

{
  kj *this_00;
  size_t size;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Array<kj::_::ExceptionOr<kj::_::Void>_> local_78;
  anon_class_1_0_00000001 local_59;
  Mapper<kj::Array<kj::Promise<void>_>_&> local_58;
  Array<kj::Own<kj::_::PromiseNode>_> local_50;
  Own<kj::_::ArrayJoinPromiseNode<void>_> local_38;
  Own<kj::_::PromiseNode> local_28;
  Array<kj::Promise<void>_> *local_18;
  Array<kj::Promise<void>_> *promises_local;
  
  local_18 = promises;
  promises_local = (Array<kj::Promise<void>_> *)this;
  _::Mapper<kj::Array<kj::Promise<void>_>_&>::Mapper(&local_58,promises);
  _::Mapper<kj::Array<kj::Promise<void>_>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_c__:1045:7)>
            (&local_50,&local_58,&local_59);
  this_00 = (kj *)Array<kj::Promise<void>_>::size(local_18);
  heapArray<kj::_::ExceptionOr<kj::_::Void>>(&local_78,this_00,size);
  heap<kj::_::ArrayJoinPromiseNode<void>,kj::Array<kj::Own<kj::_::PromiseNode>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>>
            ((kj *)&local_38,&local_50,&local_78);
  Own<kj::_::PromiseNode>::Own<kj::_::ArrayJoinPromiseNode<void>,void>(&local_28,&local_38);
  Promise<void>::Promise((Promise<void> *)this,false,&local_28);
  Own<kj::_::PromiseNode>::~Own(&local_28);
  Own<kj::_::ArrayJoinPromiseNode<void>_>::~Own(&local_38);
  Array<kj::_::ExceptionOr<kj::_::Void>_>::~Array(&local_78);
  Array<kj::Own<kj::_::PromiseNode>_>::~Array(&local_50);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<void> joinPromises(Array<Promise<void>>&& promises) {
  return Promise<void>(false, kj::heap<_::ArrayJoinPromiseNode<void>>(
      KJ_MAP(p, promises) { return kj::mv(p.node); },
      heapArray<_::ExceptionOr<_::Void>>(promises.size())));
}